

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O0

cJSON * get_object_item(cJSON *object,char *name,cJSON_bool case_sensitive)

{
  int in_EDX;
  char *in_stack_ffffffffffffffd8;
  uint in_stack_ffffffffffffffe0;
  undefined8 local_8;
  
  if (in_EDX == 0) {
    local_8 = cJSON_GetObjectItem((cJSON *)(ulong)in_stack_ffffffffffffffe0,
                                  in_stack_ffffffffffffffd8);
  }
  else {
    local_8 = cJSON_GetObjectItemCaseSensitive
                        ((cJSON *)CONCAT44(in_EDX,in_stack_ffffffffffffffe0),
                         in_stack_ffffffffffffffd8);
  }
  return local_8;
}

Assistant:

static cJSON *get_object_item(const cJSON * const object, const char * const name, const cJSON_bool case_sensitive)
{
    cJSON *current_element = NULL;

    if ((object == NULL) || (name == NULL))
    {
        return NULL;
    }

    current_element = object->child;
    if (case_sensitive)
    {
        while ((current_element != NULL) && (strcmp(name, current_element->string) != 0))
        {
            current_element = current_element->next;
        }
    }
    else
    {
        while ((current_element != NULL) && (case_insensitive_strcmp((const unsigned char*)name, (const unsigned char*)(current_element->string)) != 0))
        {
            current_element = current_element->next;
        }
    }

    return current_element;
}